

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O2

void __thiscall
github111116::ConsoleLogger::print<char*,char[23]>(ConsoleLogger *this,char **t,char (*args) [23])

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->out,*t);
  std::operator<<(poVar1," ");
  print<char[23]>(this,args);
  return;
}

Assistant:

void ConsoleLogger::print(const T& t, const Args&... args)
{
	out << t << " ";
	print(args...);
}